

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void start_tracking(void)

{
  long lVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  long trn;
  int z1;
  int y1;
  int x1;
  long local_68;
  double local_60;
  int local_54;
  int local_50;
  int local_4c;
  undefined1 local_48 [16];
  
  if (mpi_rank == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Tracking started for particles: ",0x20);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,particles_to_track_abi_cxx11_._M_dataplus._M_p,
                        particles_to_track_abi_cxx11_._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  if (((((((xtr1 < 0.0) || (xtr2 < 0.0)) || (ytr1 < 0.0)) || ((ytr2 < 0.0 || (ztr1 < 0.0)))) ||
       ((ztr2 < 0.0 || ((xlength <= xtr1 || (xlength <= xtr2)))))) || (ylength <= ytr1)) ||
     (((ylength <= ytr2 || (zlength <= ztr1)) || (zlength <= ztr2)))) {
    if (mpi_rank == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error - tracks outside of compulational domain",0x2e);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
      return;
    }
  }
  else {
    local_68 = 1;
    if (tr_init == false) {
      if (0 < n_tracks) {
        auVar16 = ZEXT864(0);
        iVar3 = 0;
        iVar15 = -1;
        do {
          dVar23 = (double)iVar3;
          dVar25 = (double)n_tracks;
          iVar14 = (int)((xtr1 + ((xtr2 - xtr1) * dVar23) / dVar25) / dx);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = ztr2;
          auVar17 = vmovhpd_avx(auVar17,ytr2);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = ztr1;
          auVar20 = vmovhpd_avx(auVar20,ytr1);
          auVar17 = vsubpd_avx(auVar17,auVar20);
          auVar18._0_8_ = auVar17._0_8_ * dVar23;
          auVar18._8_8_ = auVar17._8_8_ * dVar23;
          auVar24._8_8_ = dVar25;
          auVar24._0_8_ = dVar25;
          auVar17 = vdivpd_avx(auVar18,auVar24);
          auVar19._0_8_ = auVar20._0_8_ + auVar17._0_8_;
          auVar19._8_8_ = auVar20._8_8_ + auVar17._8_8_;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = dz;
          auVar17 = vmovhpd_avx(auVar21,dy);
          auVar17 = vdivpd_avx(auVar19,auVar17);
          auVar22._0_4_ = (int)auVar17._0_8_;
          auVar22._4_4_ = (int)auVar17._8_8_;
          auVar22._8_8_ = 0;
          if (((iVar15 != iVar14) ||
              (uVar8 = vpcmpeqd_avx512vl(auVar16._0_16_,auVar22), ((uVar8 & 0xf) >> 1 & 1) == 0)) ||
             ((uVar8 & 1) == 0)) {
            uVar13 = (ulong)(uint)n_sr;
            uVar8 = uVar13;
            do {
              uVar8 = uVar8 - 1;
              if ((int)uVar13 < 2) {
                uVar13 = 0;
                break;
              }
              uVar13 = (ulong)((int)uVar13 - 1);
            } while (iVar14 < x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar8 & 0xffffffff]);
            iVar4 = (int)uVar13;
            iVar15 = iVar14 - x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[iVar4];
            if ((0 < iVar4) && (iVar15 < nm)) {
              uVar13 = (ulong)(iVar4 - 1);
              iVar15 = (iVar15 + nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar13]) - nx_ich;
            }
            local_48 = auVar22;
            if (mpi_rank == (int)uVar13) {
              lVar1 = *(long *)(*(long *)(*(long *)(*(long *)((long)psr._M_t.
                                                  super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                                                  .super__Head_base<0UL,_spatial_region_*,_false>.
                                                  _M_head_impl + 0x218) + (long)iVar15 * 8) +
                                         (long)auVar22._4_4_ * 8) + (long)auVar22._0_4_ * 0x10);
              lVar6 = std::__cxx11::string::find(-0x68,0x65);
              if ((lVar6 != -1) && (lVar1 != 0)) {
                bVar9 = true;
                lVar7 = local_68;
                lVar6 = lVar1;
                do {
                  if ((*(double *)(lVar6 + 0x40) == -1.0) && (!NAN(*(double *)(lVar6 + 0x40)))) {
                    *(int *)(lVar6 + 0x50) = (int)lVar7;
                    lVar7 = lVar7 + 1;
                    bVar9 = false;
                    local_68 = lVar7;
                  }
                  lVar6 = *(long *)(lVar6 + 0x58);
                } while ((lVar6 != 0) && (bVar9));
              }
              lVar6 = std::__cxx11::string::find(-0x68,0x70);
              if ((lVar6 != -1) && (lVar1 != 0)) {
                bVar9 = true;
                lVar7 = local_68;
                lVar6 = lVar1;
                do {
                  if ((*(double *)(lVar6 + 0x40) == 1.0) && (!NAN(*(double *)(lVar6 + 0x40)))) {
                    *(int *)(lVar6 + 0x50) = (int)lVar7;
                    lVar7 = lVar7 + 1;
                    bVar9 = false;
                    local_68 = lVar7;
                  }
                  lVar6 = *(long *)(lVar6 + 0x58);
                } while ((lVar6 != 0) && (bVar9));
              }
              lVar6 = std::__cxx11::string::find(-0x68,0x67);
              if ((lVar6 != -1) && (lVar1 != 0)) {
                bVar9 = true;
                lVar7 = local_68;
                lVar6 = lVar1;
                do {
                  if ((*(double *)(lVar6 + 0x40) == 0.0) && (!NAN(*(double *)(lVar6 + 0x40)))) {
                    *(int *)(lVar6 + 0x50) = (int)lVar7;
                    lVar7 = lVar7 + 1;
                    bVar9 = false;
                    local_68 = lVar7;
                  }
                  lVar6 = *(long *)(lVar6 + 0x58);
                } while ((lVar6 != 0) && (bVar9));
              }
              lVar6 = std::__cxx11::string::find(-0x68,0x69);
              pdVar2 = icmr;
              if ((lVar6 != -1) && (lVar6 = (long)n_ion_populations, 0 < lVar6)) {
                lVar11 = 0;
                lVar7 = local_68;
                do {
                  if (lVar1 != 0) {
                    dVar23 = pdVar2[lVar11];
                    bVar9 = true;
                    lVar12 = lVar1;
                    do {
                      if ((*(double *)(lVar12 + 0x40) == dVar23) &&
                         (!NAN(*(double *)(lVar12 + 0x40)) && !NAN(dVar23))) {
                        *(int *)(lVar12 + 0x50) = (int)lVar7;
                        lVar7 = lVar7 + 1;
                        bVar9 = false;
                        local_68 = lVar7;
                      }
                      lVar12 = *(long *)(lVar12 + 0x58);
                    } while ((lVar12 != 0) && (bVar9));
                  }
                  lVar11 = lVar11 + 1;
                } while (lVar11 != lVar6);
              }
            }
            MPI_Bcast(&local_68,1,&ompi_mpi_long,uVar13,&ompi_mpi_comm_world);
            auVar16 = ZEXT1664(local_48);
            iVar15 = iVar14;
          }
          iVar3 = iVar3 + 1;
        } while (iVar3 < n_tracks);
      }
    }
    else if (0 < n_tracks) {
      iVar15 = 0;
      do {
        local_48._0_8_ = xtr1;
        local_60 = xtr2 - xtr1;
        iVar3 = rand();
        local_4c = (int)((((double)iVar3 * local_60) / 2147483647.0 + (double)local_48._0_8_) / dx);
        local_48._0_8_ = ytr1;
        local_60 = ytr2 - ytr1;
        iVar3 = rand();
        local_50 = (int)((((double)iVar3 * local_60) / 2147483647.0 + (double)local_48._0_8_) / dy);
        local_48._0_8_ = ztr1;
        local_60 = ztr2 - ztr1;
        iVar3 = rand();
        local_54 = (int)((((double)iVar3 * local_60) / 2147483647.0 + (double)local_48._0_8_) / dz);
        MPI_Bcast(&local_4c,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
        MPI_Bcast(&local_50,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
        MPI_Bcast(&local_54,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
        iVar3 = n_sr;
        uVar10 = n_sr;
        do {
          uVar10 = uVar10 - 1;
          if (iVar3 < 2) {
            iVar3 = 0;
            break;
          }
          iVar3 = iVar3 + -1;
        } while (local_4c <
                 x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar10]);
        iVar4 = local_4c -
                x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar3];
        iVar14 = 0;
        if ((iVar3 != 0) && (iVar14 = iVar3, iVar4 < nm)) {
          iVar4 = (iVar4 + nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)iVar3 + -1]) - nx_ich;
          iVar14 = iVar3 + -1;
        }
        if (mpi_rank == iVar14) {
          lVar1 = *(long *)(*(long *)(*(long *)(*(long *)((long)psr._M_t.
                                                  super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                                                  .super__Head_base<0UL,_spatial_region_*,_false>.
                                                  _M_head_impl + 0x218) + (long)iVar4 * 8) +
                                     (long)local_50 * 8) + (long)local_54 * 0x10);
          lVar6 = std::__cxx11::string::find(-0x68,0x65);
          if ((lVar6 != -1) && (lVar1 != 0)) {
            bVar9 = true;
            lVar7 = local_68;
            lVar6 = lVar1;
            do {
              if ((*(double *)(lVar6 + 0x40) == -1.0) && (!NAN(*(double *)(lVar6 + 0x40)))) {
                *(int *)(lVar6 + 0x50) = (int)lVar7;
                lVar7 = lVar7 + 1;
                bVar9 = false;
                local_68 = lVar7;
              }
              lVar6 = *(long *)(lVar6 + 0x58);
            } while ((lVar6 != 0) && (bVar9));
          }
          lVar6 = std::__cxx11::string::find(-0x68,0x70);
          if ((lVar6 != -1) && (lVar1 != 0)) {
            bVar9 = true;
            lVar7 = local_68;
            lVar6 = lVar1;
            do {
              if ((*(double *)(lVar6 + 0x40) == 1.0) && (!NAN(*(double *)(lVar6 + 0x40)))) {
                *(int *)(lVar6 + 0x50) = (int)lVar7;
                lVar7 = lVar7 + 1;
                bVar9 = false;
                local_68 = lVar7;
              }
              lVar6 = *(long *)(lVar6 + 0x58);
            } while ((lVar6 != 0) && (bVar9));
          }
          lVar6 = std::__cxx11::string::find(-0x68,0x67);
          if ((lVar6 != -1) && (lVar1 != 0)) {
            bVar9 = true;
            lVar7 = local_68;
            lVar6 = lVar1;
            do {
              if ((*(double *)(lVar6 + 0x40) == 0.0) && (!NAN(*(double *)(lVar6 + 0x40)))) {
                *(int *)(lVar6 + 0x50) = (int)lVar7;
                lVar7 = lVar7 + 1;
                bVar9 = false;
                local_68 = lVar7;
              }
              lVar6 = *(long *)(lVar6 + 0x58);
            } while ((lVar6 != 0) && (bVar9));
          }
          lVar6 = std::__cxx11::string::find(-0x68,0x69);
          pdVar2 = icmr;
          if ((lVar6 != -1) && (lVar6 = (long)n_ion_populations, 0 < lVar6)) {
            lVar11 = 0;
            lVar7 = local_68;
            do {
              if (lVar1 != 0) {
                dVar23 = pdVar2[lVar11];
                bVar9 = true;
                lVar12 = lVar1;
                do {
                  if ((*(double *)(lVar12 + 0x40) == dVar23) &&
                     (!NAN(*(double *)(lVar12 + 0x40)) && !NAN(dVar23))) {
                    *(int *)(lVar12 + 0x50) = (int)lVar7;
                    lVar7 = lVar7 + 1;
                    bVar9 = false;
                    local_68 = lVar7;
                  }
                  lVar12 = *(long *)(lVar12 + 0x58);
                } while ((lVar12 != 0) && (bVar9));
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 != lVar6);
          }
        }
        MPI_Bcast(&local_68,1,&ompi_mpi_long,iVar14,&ompi_mpi_comm_world);
        iVar15 = iVar15 + 1;
      } while (iVar15 < n_tracks);
    }
    iVar15 = nm;
    exchange_fields(nm,nm);
    exchange_particles(iVar15,iVar15);
  }
  return;
}

Assistant:

void start_tracking()
{
    if (mpi_rank == 0) {
        cout << "Tracking started for particles: " << particles_to_track << endl;
    }
    if (xtr1 < 0 || xtr2 < 0 || ytr1 < 0 || ytr2 < 0 || ztr1 < 0 || ztr2 < 0 ||
        xtr1 >= xlength || xtr2 >= xlength || ytr1 >= ylength || ytr2 >= ylength || ztr1 >= zlength || ztr2 >= zlength)
    {
        if (mpi_rank == 0) {
            cout << "Error - tracks outside of compulational domain" << endl;
        }
        return;
    }
    long trn = 1; // trn = 0 for untracked particles
    if (tr_init==0) {
        int x1,y1,z1,x2,y2,z2;
        x1 = -1;
        y1 = 0;
        z1 = 0;
        for (int i=0;i<n_tracks;i++) {
            x2 = (xtr1 + (xtr2-xtr1)*i/n_tracks)/dx;
            y2 = (ytr1 + (ytr2-ytr1)*i/n_tracks)/dy;
            z2 = (ztr1 + (ztr2-ztr1)*i/n_tracks)/dz;
            if (x2!=x1 || y2!=y1 || z2!=z1) {
                x1 = x2;
                y1 = y2;
                z1 = z2;
                int n,x;
                n = get_sr_for_index(x2);
                x = x2 - x0_sr[n];
                if (n>0 && x<nm) {
                    n = n - 1;
                    x = x + nx_sr[n] - nx_ich;
                }
                if (mpi_rank == n) {
                    particle* h = psr->cp[x][y2][z2].pl.head;
                    particle* p = h;
                    bool b = 1;
                    if (particles_to_track.find('e') != string::npos)
                    {
                        while (p!=0 && b) {
                            if (p->cmr==-1) {
                                p->trn = trn;
                                trn++;
                                b = 0;
                            }
                            p = p->next;
                        }
                    }
                    if (particles_to_track.find('p') != string::npos)
                    {
                        p = h;
                        b = 1;
                        while (p!=0 && b) {
                            if (p->cmr==1) {
                                p->trn = trn;
                                trn++;
                                b = 0;
                            }
                            p = p->next;
                        }
                    }
                    if (particles_to_track.find('g') != string::npos)
                    {
                        p = h;
                        b = 1;
                        while (p!=0 && b) {
                            if (p->cmr==0) {
                                p->trn = trn;
                                trn++;
                                b = 0;
                            }
                            p = p->next;
                        }
                    }
                    if (particles_to_track.find('i') != string::npos)
                    {
                        for (int m=0;m<n_ion_populations;m++) {
                            p = h;
                            b = 1;
                            while (p!=0 && b) {
                                if (p->cmr==icmr[m]) {
                                    p->trn = trn;
                                    trn++;
                                    b = 0;
                                }
                                p = p->next;
                            }
                        }
                    }
                }
                MPI_Bcast(&trn, 1, MPI_LONG, n, MPI_COMM_WORLD);
            }
        }
    } else {
        for (int i=0;i<n_tracks;i++) {
            int x1 = ( xtr1 + ( xtr2 - xtr1 ) * rand( ) / RAND_MAX ) / dx;
            int y1 = ( ytr1 + ( ytr2 - ytr1 ) * rand( ) / RAND_MAX ) / dy;
            int z1 = ( ztr1 + ( ztr2 - ztr1 ) * rand( ) / RAND_MAX ) / dz;
            MPI_Bcast(&x1, 1, MPI_INT, 0, MPI_COMM_WORLD);
            MPI_Bcast(&y1, 1, MPI_INT, 0, MPI_COMM_WORLD);
            MPI_Bcast(&z1, 1, MPI_INT, 0, MPI_COMM_WORLD);

            int n,x;
            n = get_sr_for_index(x1);
            x = x1 - x0_sr[n];
            if (n!=0 && x<nm) {
                n = n - 1;
                x = x + nx_sr[n] - nx_ich;
            }
            if (mpi_rank == n) {
                particle* h = psr->cp[x][y1][z1].pl.head;
                particle* p = h;
                bool b = 1;
                if (particles_to_track.find('e') != string::npos)
                {
                    while (p!=0 && b) {
                        if (p->cmr==-1) {
                            p->trn = trn;
                            trn++;
                            b = 0;
                        }
                        p = p->next;
                    }
                }
                if (particles_to_track.find('p') != string::npos)
                {
                    p = h;
                    b = 1;
                    while (p!=0 && b) {
                        if (p->cmr==1) {
                            p->trn = trn;
                            trn++;
                            b = 0;
                        }
                        p = p->next;
                    }
                }
                if (particles_to_track.find('g') != string::npos)
                {
                    p = h;
                    b = 1;
                    while (p!=0 && b) {
                        if (p->cmr==0) {
                            p->trn = trn;
                            trn++;
                            b = 0;
                        }
                        p = p->next;
                    }
                }
                if (particles_to_track.find('i') != string::npos)
                {
                    for (int m=0;m<n_ion_populations;m++) {
                        p = h;
                        b = 1;
                        while (p!=0 && b) {
                            if (p->cmr==icmr[m]) {
                                p->trn = trn;
                                trn++;
                                b = 0;
                            }
                            p = p->next;
                        }
                    }
                }
            }
            MPI_Bcast(&trn, 1, MPI_LONG, n, MPI_COMM_WORLD);
        }
    }

    // make the same particles tracked in all regions, so that tracks aren't lost at the first exchange
    synchronize_regions(false);
}